

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlReplaceNode(xmlNodePtr old,xmlNodePtr cur)

{
  int iVar1;
  xmlNodePtr cur_local;
  xmlNodePtr old_local;
  
  if (old == cur) {
    old_local = (xmlNodePtr)0x0;
  }
  else if (((old == (xmlNodePtr)0x0) || (old->type == XML_NAMESPACE_DECL)) ||
          (old->parent == (_xmlNode *)0x0)) {
    old_local = (xmlNodePtr)0x0;
  }
  else {
    old_local = old;
    if ((cur == (xmlNodePtr)0x0) || (cur->type == XML_NAMESPACE_DECL)) {
      xmlUnlinkNode(old);
    }
    else if (((old->type != XML_ATTRIBUTE_NODE) || (cur->type == XML_ATTRIBUTE_NODE)) &&
            ((cur->type != XML_ATTRIBUTE_NODE || (old->type == XML_ATTRIBUTE_NODE)))) {
      xmlUnlinkNodeInternal(cur);
      iVar1 = xmlSetTreeDoc(cur,old->doc);
      if (iVar1 < 0) {
        old_local = (xmlNodePtr)0x0;
      }
      else {
        cur->parent = old->parent;
        cur->next = old->next;
        if (cur->next != (_xmlNode *)0x0) {
          cur->next->prev = cur;
        }
        cur->prev = old->prev;
        if (cur->prev != (_xmlNode *)0x0) {
          cur->prev->next = cur;
        }
        if (cur->parent != (_xmlNode *)0x0) {
          if (cur->type == XML_ATTRIBUTE_NODE) {
            if ((xmlNodePtr)cur->parent->properties == old) {
              cur->parent->properties = (_xmlAttr *)cur;
            }
          }
          else {
            if (cur->parent->children == old) {
              cur->parent->children = cur;
            }
            if (cur->parent->last == old) {
              cur->parent->last = cur;
            }
          }
        }
        old->prev = (_xmlNode *)0x0;
        old->next = (_xmlNode *)0x0;
        old->parent = (_xmlNode *)0x0;
      }
    }
  }
  return old_local;
}

Assistant:

xmlNodePtr
xmlReplaceNode(xmlNodePtr old, xmlNodePtr cur) {
    if (old == cur) return(NULL);
    if ((old == NULL) || (old->type == XML_NAMESPACE_DECL) ||
        (old->parent == NULL)) {
	return(NULL);
    }
    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL)) {
        /* Don't call xmlUnlinkNodeInternal to handle DTDs. */
	xmlUnlinkNode(old);
	return(old);
    }
    if ((old->type==XML_ATTRIBUTE_NODE) && (cur->type!=XML_ATTRIBUTE_NODE)) {
	return(old);
    }
    if ((cur->type==XML_ATTRIBUTE_NODE) && (old->type!=XML_ATTRIBUTE_NODE)) {
	return(old);
    }
    xmlUnlinkNodeInternal(cur);
    if (xmlSetTreeDoc(cur, old->doc) < 0)
        return(NULL);
    cur->parent = old->parent;
    cur->next = old->next;
    if (cur->next != NULL)
	cur->next->prev = cur;
    cur->prev = old->prev;
    if (cur->prev != NULL)
	cur->prev->next = cur;
    if (cur->parent != NULL) {
	if (cur->type == XML_ATTRIBUTE_NODE) {
	    if (cur->parent->properties == (xmlAttrPtr)old)
		cur->parent->properties = ((xmlAttrPtr) cur);
	} else {
	    if (cur->parent->children == old)
		cur->parent->children = cur;
	    if (cur->parent->last == old)
		cur->parent->last = cur;
	}
    }
    old->next = old->prev = NULL;
    old->parent = NULL;
    return(old);
}